

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlackCard.cpp
# Opt level: O2

void __thiscall BlackCard::BlackCard(BlackCard *this,string *n,int t)

{
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)n);
  Card::Card(&this->super_Card,&local_40,t);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_Card)._vptr_Card = (_func_int **)&PTR_effectBonus_001161b8;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->tapped = false;
  this->revealed = false;
  this->type = t;
  return;
}

Assistant:

BlackCard::BlackCard(string n, int t): Card{n, t}
{
    name = n;

    tapped = false;
    revealed = false;
    type = Type(t);
}